

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall cmCTestLaunch::WriteXMLLabels(cmCTestLaunch *this,cmXMLWriter *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  char *__end;
  _Rb_tree_header *p_Var3;
  string local_50;
  
  LoadLabels(this);
  if ((this->Labels)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    cmXMLWriter::Comment(xml,"Interested parties");
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Labels","");
    cmXMLWriter::StartElement(xml,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(this->Labels)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      do {
        local_50._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Label","");
        cmXMLWriter::StartElement(xml,&local_50);
        cmXMLWriter::Content<std::__cxx11::string>
                  (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var2 + 1));
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
    cmXMLWriter::EndElement(xml);
  }
  return;
}

Assistant:

void cmCTestLaunch::WriteXMLLabels(cmXMLWriter& xml)
{
  this->LoadLabels();
  if(!this->Labels.empty())
    {
    xml.Comment("Interested parties");
    xml.StartElement("Labels");
    for(std::set<std::string>::const_iterator li = this->Labels.begin();
        li != this->Labels.end(); ++li)
      {
      xml.Element("Label", *li);
      }
    xml.EndElement(); // Labels
    }
}